

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_protocol.cpp
# Opt level: O0

int PackUserCmd(usercmd_t *ucmd,usercmd_t *basis,BYTE **stream)

{
  uint uVar1;
  BYTE *pBVar2;
  uint uVar3;
  byte local_50;
  byte local_4f;
  byte local_4e;
  BYTE bytes [4];
  DWORD buttons_changed;
  usercmd_t blank;
  BYTE *start;
  BYTE *temp;
  BYTE **ppBStack_20;
  BYTE flags;
  BYTE **stream_local;
  usercmd_t *basis_local;
  usercmd_t *ucmd_local;
  
  temp._7_1_ = 0;
  start = *stream;
  pBVar2 = *stream;
  ppBStack_20 = stream;
  stream_local = (BYTE **)basis;
  basis_local = ucmd;
  if (basis == (usercmd_t *)0x0) {
    memset(bytes,0,0x10);
    stream_local = (BYTE **)bytes;
  }
  WriteByte('\0',ppBStack_20);
  uVar3 = basis_local->buttons ^ *(uint *)stream_local;
  if (uVar3 != 0) {
    local_50 = (byte)basis_local->buttons & 0x7f;
    local_4f = (byte)(basis_local->buttons >> 7) & 0x7f;
    local_4e = (byte)(basis_local->buttons >> 0xe) & 0x7f;
    uVar1 = basis_local->buttons;
    temp._7_1_ = temp._7_1_ | 1;
    if ((((uVar3 & 0xffffff80) != 0) && (local_50 = local_50 | 0x80, (uVar3 & 0xffffc000) != 0)) &&
       (local_4f = local_4f | 0x80, (uVar3 & 0xffe00000) != 0)) {
      local_4e = local_4e | 0x80;
    }
    WriteByte(local_50,ppBStack_20);
    if ((((local_50 & 0x80) != 0) && (WriteByte(local_4f,ppBStack_20), (local_4f & 0x80) != 0)) &&
       (WriteByte(local_4e,ppBStack_20), (local_4e & 0x80) != 0)) {
      WriteByte((BYTE)(uVar1 >> 0x15),ppBStack_20);
    }
  }
  if (basis_local->pitch != *(short *)((long)stream_local + 4)) {
    temp._7_1_ = temp._7_1_ | 2;
    WriteWord(basis_local->pitch,ppBStack_20);
  }
  if (basis_local->yaw != *(short *)((long)stream_local + 6)) {
    temp._7_1_ = temp._7_1_ | 4;
    WriteWord(basis_local->yaw,ppBStack_20);
  }
  if (basis_local->forwardmove != *(short *)((long)stream_local + 10)) {
    temp._7_1_ = temp._7_1_ | 8;
    WriteWord(basis_local->forwardmove,ppBStack_20);
  }
  if (basis_local->sidemove != *(short *)((long)stream_local + 0xc)) {
    temp._7_1_ = temp._7_1_ | 0x10;
    WriteWord(basis_local->sidemove,ppBStack_20);
  }
  if (basis_local->upmove != *(short *)((long)stream_local + 0xe)) {
    temp._7_1_ = temp._7_1_ | 0x20;
    WriteWord(basis_local->upmove,ppBStack_20);
  }
  if (basis_local->roll != *(short *)(stream_local + 1)) {
    temp._7_1_ = temp._7_1_ | 0x40;
    WriteWord(basis_local->roll,ppBStack_20);
  }
  WriteByte(temp._7_1_,&start);
  return (int)*ppBStack_20 - (int)pBVar2;
}

Assistant:

int PackUserCmd (const usercmd_t *ucmd, const usercmd_t *basis, BYTE **stream)
{
	BYTE flags = 0;
	BYTE *temp = *stream;
	BYTE *start = *stream;
	usercmd_t blank;
	DWORD buttons_changed;

	if (basis == NULL)
	{
		memset (&blank, 0, sizeof(blank));
		basis = &blank;
	}

	WriteByte (0, stream);			// Make room for the packing bits

	buttons_changed = ucmd->buttons ^ basis->buttons;
	if (buttons_changed != 0)
	{
		BYTE bytes[4] = {  BYTE(ucmd->buttons        & 0x7F),
						  BYTE((ucmd->buttons >> 7)  & 0x7F),
						  BYTE((ucmd->buttons >> 14) & 0x7F),
						  BYTE((ucmd->buttons >> 21) & 0xFF) };

		flags |= UCMDF_BUTTONS;

		if (buttons_changed & 0xFFFFFF80)
		{
			bytes[0] |= 0x80;
			if (buttons_changed & 0xFFFFC000)
			{
				bytes[1] |= 0x80;
				if (buttons_changed & 0xFFE00000)
				{
					bytes[2] |= 0x80;
				}
			}
		}
		WriteByte (bytes[0], stream);
		if (bytes[0] & 0x80)
		{
			WriteByte (bytes[1], stream);
			if (bytes[1] & 0x80)
			{
				WriteByte (bytes[2], stream);
				if (bytes[2] & 0x80)
				{
					WriteByte (bytes[3], stream);
				}
			}
		}
	}
	if (ucmd->pitch != basis->pitch)
	{
		flags |= UCMDF_PITCH;
		WriteWord (ucmd->pitch, stream);
	}
	if (ucmd->yaw != basis->yaw)
	{
		flags |= UCMDF_YAW;
		WriteWord (ucmd->yaw, stream);
	}
	if (ucmd->forwardmove != basis->forwardmove)
	{
		flags |= UCMDF_FORWARDMOVE;
		WriteWord (ucmd->forwardmove, stream);
	}
	if (ucmd->sidemove != basis->sidemove)
	{
		flags |= UCMDF_SIDEMOVE;
		WriteWord (ucmd->sidemove, stream);
	}
	if (ucmd->upmove != basis->upmove)
	{
		flags |= UCMDF_UPMOVE;
		WriteWord (ucmd->upmove, stream);
	}
	if (ucmd->roll != basis->roll)
	{
		flags |= UCMDF_ROLL;
		WriteWord (ucmd->roll, stream);
	}

	// Write the packing bits
	WriteByte (flags, &temp);

	return int(*stream - start);
}